

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
emplace_back<char_const(&)[26],jsoncons::semantic_tag>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,char (*args) [26],
          semantic_tag *args_1)

{
  json_storage_kind jVar1;
  array_storage *this_00;
  json_runtime_error<std::domain_error,_void> *this_01;
  char (*in_RDX) [26];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_RDI;
  string *in_stack_ffffffffffffff88;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffff98) [26];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  semantic_tag *in_stack_ffffffffffffffd8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_8;
  
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::storage_kind
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI);
  if (jVar1 == json_reference) {
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffff90);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::json_reference_storage::value
              ((json_reference_storage *)0x33f3b8);
    local_8 = emplace_back<char_const(&)[26],jsoncons::semantic_tag>
                        (in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  }
  else {
    if (jVar1 != array) {
      this_01 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      json_runtime_error<std::domain_error,_void>::json_runtime_error
                (this_01,in_stack_ffffffffffffff88);
      __cxa_throw(this_01,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    this_00 = cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                        (in_stack_ffffffffffffff90);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_storage::value(this_00);
    local_8 = json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
              ::emplace_back<char_const(&)[26],jsoncons::semantic_tag>
                        (in_RDI,in_stack_ffffffffffffff98,(semantic_tag *)in_stack_ffffffffffffff90)
    ;
  }
  return local_8;
}

Assistant:

basic_json& emplace_back(Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return cast<array_storage>().value().emplace_back(std::forward<Args>(args)...);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().emplace_back(std::forward<Args>(args)...);
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }